

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O1

Builder<prometheus::Gauge> * prometheus::BuildGauge(void)

{
  _Rb_tree_header *p_Var1;
  Builder<prometheus::Gauge> *in_RDI;
  
  p_Var1 = &(in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->name_)._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->name_)._M_string_length = 0;
  (in_RDI->name_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->name_).field_2 + 8) = 0;
  (in_RDI->help_)._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->help_)._M_string_length = 0;
  (in_RDI->help_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->help_).field_2 + 8) = 0;
  *(undefined8 *)&(in_RDI->labels_)._M_t._M_impl = 0;
  *(undefined8 *)&(in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->name_)._M_dataplus._M_p = (pointer)&(in_RDI->name_).field_2;
  (in_RDI->name_)._M_string_length = 0;
  (in_RDI->name_).field_2._M_local_buf[0] = '\0';
  (in_RDI->help_)._M_dataplus._M_p = (pointer)&(in_RDI->help_).field_2;
  (in_RDI->help_)._M_string_length = 0;
  (in_RDI->help_).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

detail::Builder<Gauge> BuildGauge() { return {}; }